

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Graph<Node> * __thiscall
Graph<Node>::operator*(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,Graph<Node> *other)

{
  int *piVar1;
  Edge *pEVar2;
  NodeList<Node> *pNVar3;
  int iVar4;
  int iVar5;
  Edge *pEVar6;
  Node *pNVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  NodeList<Node> *pNVar14;
  int iVar15;
  int *__size;
  long lVar16;
  long lVar17;
  Graph<Node> *ans;
  Graph<Node> g2;
  Graph<Node> g1;
  Graph<Node> local_100;
  Graph<Node> local_98;
  
  Graph(&local_98,this);
  Graph(&local_100,other);
  pEVar6 = local_98.edges.vect;
  uVar13 = (ulong)local_98.edges._size;
  if (uVar13 != 0) {
    pEVar2 = local_98.edges.vect + uVar13;
    lVar17 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::__introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_98.edges.vect,pEVar2,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>(pEVar6,pEVar2);
  }
  pEVar6 = local_100.edges.vect;
  uVar13 = (ulong)local_100.edges._size;
  if (uVar13 != 0) {
    pEVar2 = local_100.edges.vect + uVar13;
    lVar17 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::__introsort_loop<Edge*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_100.edges.vect,pEVar2,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Edge*,__gnu_cxx::__ops::_Iter_less_iter>(pEVar6,pEVar2);
  }
  if (local_100._nodeCnt < local_98._nodeCnt) {
    local_100._nodeCnt = local_98._nodeCnt;
  }
  Graph(__return_storage_ptr__,local_100._nodeCnt);
  if (0 < local_98._edgeCnt) {
    lVar17 = 0;
    iVar15 = local_98._edgeCnt;
    iVar10 = local_100._edgeCnt;
    do {
      if (0 < iVar10) {
        pEVar6 = local_98.edges.vect + lVar17;
        iVar4 = pEVar6->_nodeS;
        iVar12 = pEVar6->_nodeD;
        __size = &(local_100.edges.vect)->_cost;
        lVar16 = 1;
        do {
          piVar1 = __size + -1;
          bVar9 = ((Edge *)(__size + -2))->_nodeS == iVar4;
          if (*piVar1 == iVar12 && bVar9) {
            iVar15 = pEVar6->_cost;
            iVar10 = *__size;
            __return_storage_ptr__->_edgeCnt = __return_storage_ptr__->_edgeCnt + 1;
            iVar11 = (__return_storage_ptr__->edges)._size;
            iVar5 = (__return_storage_ptr__->edges)._capacity;
            if (iVar15 < iVar10) {
              if (iVar5 <= iVar11) {
                vector<Edge>::realloc
                          (&__return_storage_ptr__->edges,(void *)(ulong)(uint)(iVar5 * 2),
                           (size_t)__size);
                iVar11 = (__return_storage_ptr__->edges)._size;
              }
              (__return_storage_ptr__->edges)._size = iVar11 + 1;
              pEVar6 = (__return_storage_ptr__->edges).vect;
              pEVar6[iVar11]._nodeS = iVar4;
              pEVar6[iVar11]._nodeD = iVar12;
              pEVar6[iVar11]._cost = iVar15;
              pNVar14 = (__return_storage_ptr__->G).vect;
              pNVar3 = pNVar14 + iVar4;
              iVar10 = (pNVar3->nodes)._size;
              iVar11 = (pNVar3->nodes)._capacity;
              if (iVar11 <= iVar10) {
                vector<Node>::realloc
                          (&pNVar3->nodes,(void *)(ulong)(uint)(iVar11 * 2),
                           (size_t)__return_storage_ptr__);
                iVar10 = (pNVar3->nodes)._size;
                pNVar14 = (__return_storage_ptr__->G).vect;
              }
              (pNVar3->nodes)._size = iVar10 + 1;
              pNVar7 = (pNVar3->nodes).vect;
              pNVar7[iVar10]._index = iVar12;
              pNVar7[iVar10]._costTo = iVar15;
              pNVar14 = pNVar14 + iVar12;
              iVar12 = (pNVar14->nodes)._size;
              iVar11 = (pNVar14->nodes)._capacity;
              iVar10 = iVar15;
              if (iVar11 <= iVar12) {
                vector<Node>::realloc
                          (&pNVar14->nodes,(void *)(ulong)(uint)(iVar11 * 2),(size_t)pNVar7);
LAB_00101e25:
                iVar12 = (pNVar14->nodes)._size;
              }
            }
            else {
              if (iVar5 <= iVar11) {
                vector<Edge>::realloc
                          (&__return_storage_ptr__->edges,(void *)(ulong)(uint)(iVar5 * 2),
                           (size_t)__size);
                iVar11 = (__return_storage_ptr__->edges)._size;
              }
              (__return_storage_ptr__->edges)._size = iVar11 + 1;
              pEVar6 = (__return_storage_ptr__->edges).vect;
              pEVar6[iVar11]._nodeS = iVar4;
              pEVar6[iVar11]._nodeD = iVar12;
              pEVar6[iVar11]._cost = iVar10;
              pNVar14 = (__return_storage_ptr__->G).vect;
              pNVar3 = pNVar14 + iVar4;
              iVar15 = (pNVar3->nodes)._size;
              iVar11 = (pNVar3->nodes)._capacity;
              if (iVar11 <= iVar15) {
                vector<Node>::realloc
                          (&pNVar3->nodes,(void *)(ulong)(uint)(iVar11 * 2),
                           (size_t)__return_storage_ptr__);
                iVar15 = (pNVar3->nodes)._size;
                pNVar14 = (__return_storage_ptr__->G).vect;
              }
              (pNVar3->nodes)._size = iVar15 + 1;
              pNVar7 = (pNVar3->nodes).vect;
              pNVar7[iVar15]._index = iVar12;
              pNVar7[iVar15]._costTo = iVar10;
              pNVar14 = pNVar14 + iVar12;
              iVar12 = (pNVar14->nodes)._size;
              iVar15 = (pNVar14->nodes)._capacity;
              if (iVar15 <= iVar12) {
                vector<Node>::realloc
                          (&pNVar14->nodes,(void *)(ulong)(uint)(iVar15 * 2),(size_t)pNVar7);
                goto LAB_00101e25;
              }
            }
            (pNVar14->nodes)._size = iVar12 + 1;
            pNVar7 = (pNVar14->nodes).vect;
            pNVar7[iVar12]._index = iVar4;
            pNVar7[iVar12]._costTo = iVar10;
            iVar15 = local_98._edgeCnt;
            iVar10 = local_100._edgeCnt;
            break;
          }
          bVar8 = lVar16 < local_100._edgeCnt;
          __size = __size + 3;
          lVar16 = lVar16 + 1;
          iVar15 = local_98._edgeCnt;
          iVar10 = local_100._edgeCnt;
        } while (bVar8 && (*piVar1 != iVar12 || !bVar9));
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar15);
  }
  ~Graph(&local_100);
  ~Graph(&local_98);
  return __return_storage_ptr__;
}

Assistant:

Graph operator * (const Graph &other) const {
        Graph g1 = *this;
        Graph g2 = other;

        std::sort(g1.edges.begin(), g1.edges.end());
//        g1.edges.mergeSort(0, g1._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        std::sort(g2.edges.begin(), g2.edges.end());
//        g2.edges.mergeSort(0, g2._edgeCnt - 1, [](Edge a, Edge b) {
//            return a < b;
//        });

        Graph ans(max(g1.size(), g2.size()));

        for (int i = 0; i < g1.edgeCnt(); ++i) {
            bool added = false;
            for (int j = 0; j < g2.edgeCnt() and !added; ++j) {
                Edge g1Edge = g1.getEdge(i);
                Edge g2Edge = g2.getEdge(j);
                if (g1Edge == g2Edge and g1Edge.getCost() < g2Edge.getCost()) {
                    added = true;
                    ans.addEdge(g1Edge);
                }
                else if (g1Edge == g2Edge) {
                    added = true;
                    ans.addEdge(g2Edge);
                }
            }

//            if (!added) {
//                ans.addEdge(g1.getEdge(i));
//            }
        }

        return ans;
    }